

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O1

double __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::get_double(basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
             *this,error_code *ec)

{
  byte *pbVar1;
  byte *pbVar2;
  byte *pbVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  double dVar7;
  uint8_t b;
  uint8_t buf [4];
  uint8_t buf_1 [8];
  byte local_1d;
  uint local_1c;
  ulong local_18;
  
  pbVar1 = (this->source_).current_._M_current;
  pbVar2 = (this->source_).end_._M_current;
  uVar4 = (ulong)(pbVar2 != pbVar1);
  if (pbVar2 != pbVar1) {
    uVar6 = 0;
    pbVar3 = pbVar1;
    do {
      (this->source_).current_._M_current = pbVar3 + 1;
      (&local_1d)[uVar6] = *pbVar3;
      uVar6 = uVar6 + 1;
      pbVar3 = pbVar3 + 1;
    } while (uVar4 != uVar6);
  }
  sVar5 = uVar4 + (this->source_).position_;
  (this->source_).position_ = sVar5;
  if (pbVar2 == pbVar1) {
    std::error_code::operator=(ec,unexpected_eof);
    this->more_ = false;
    dVar7 = 0.0;
  }
  else if ((local_1d & 0x1f) == 0x1b) {
    pbVar1 = (this->source_).current_._M_current;
    uVar4 = 8;
    if ((ulong)((long)pbVar2 - (long)pbVar1) < 8) {
      uVar4 = (long)pbVar2 - (long)pbVar1;
    }
    if (pbVar2 != pbVar1) {
      uVar6 = 0;
      pbVar3 = pbVar1;
      do {
        (this->source_).current_._M_current = pbVar3 + 1;
        *(byte *)((long)&local_18 + uVar6) = *pbVar3;
        uVar6 = uVar6 + 1;
        pbVar3 = pbVar3 + 1;
      } while (uVar4 != uVar6);
    }
    (this->source_).position_ = uVar4 + sVar5;
    if ((ulong)((long)pbVar2 - (long)pbVar1) < 8) {
      std::error_code::operator=(ec,unexpected_eof);
      this->more_ = false;
      return 0.0;
    }
    dVar7 = (double)(local_18 >> 0x38 | (local_18 & 0xff000000000000) >> 0x28 |
                     (local_18 & 0xff0000000000) >> 0x18 | (local_18 & 0xff00000000) >> 8 |
                     (local_18 & 0xff000000) << 8 | (local_18 & 0xff0000) << 0x18 |
                     (local_18 & 0xff00) << 0x28 | local_18 << 0x38);
  }
  else {
    dVar7 = 0.0;
    if ((local_1d & 0x1f) == 0x1a) {
      pbVar1 = (this->source_).current_._M_current;
      uVar4 = 4;
      if ((ulong)((long)pbVar2 - (long)pbVar1) < 4) {
        uVar4 = (long)pbVar2 - (long)pbVar1;
      }
      if (pbVar2 != pbVar1) {
        uVar6 = 0;
        pbVar3 = pbVar1;
        do {
          (this->source_).current_._M_current = pbVar3 + 1;
          *(byte *)((long)&local_1c + uVar6) = *pbVar3;
          uVar6 = uVar6 + 1;
          pbVar3 = pbVar3 + 1;
        } while (uVar4 != uVar6);
      }
      (this->source_).position_ = uVar4 + sVar5;
      if ((ulong)((long)pbVar2 - (long)pbVar1) < 4) {
        std::error_code::operator=(ec,unexpected_eof);
        this->more_ = false;
        return 0.0;
      }
      dVar7 = (double)(float)(local_1c >> 0x18 | (local_1c & 0xff0000) >> 8 |
                              (local_1c & 0xff00) << 8 | local_1c << 0x18);
    }
  }
  return dVar7;
}

Assistant:

double get_double(std::error_code& ec)
    {
        double val = 0;

        uint8_t b;
        if (source_.read(&b, 1) == 0)
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return 0;
        }
        uint8_t info = get_additional_information_value(b);
        switch (info)
        {
        case 0x1a: // Single-Precision Float (four-byte IEEE 754)
            {
                uint8_t buf[sizeof(float)];
                if (source_.read(buf, sizeof(float)) !=sizeof(float)) 
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                val = binary::big_to_native<float>(buf, sizeof(buf));
                break;
            }

        case 0x1b: //  Double-Precision Float (eight-byte IEEE 754)
            {
                uint8_t buf[sizeof(double)];
                if (source_.read(buf, sizeof(double)) != sizeof(double))
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                val = binary::big_to_native<double>(buf, sizeof(buf));
                break;
            }
            default:
                break;
        }
        
        return val;
    }